

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

GLint __thiscall
gl4cts::TextureViewTestViewSampling::getMaxConformantSampleCount
          (TextureViewTestViewSampling *this,GLenum target,GLenum internalFormat)

{
  int iVar1;
  RenderContext *pRVar2;
  GLint GVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  void *pvVar8;
  undefined4 in_register_00000014;
  GLint i;
  long lVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  GLint isConformant;
  GLint gl_sample_counts;
  GLint local_34;
  long lVar7;
  
  local_34 = 0;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar2->_vptr_RenderContext[3])
                    (pRVar2,CONCAT44(in_register_00000034,target),
                     CONCAT44(in_register_00000014,internalFormat));
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_NV_internalformat_sample_query");
  if (bVar4) {
    gl_sample_counts = 0;
    (**(code **)(lVar7 + 0x880))(target,0x8058,0x9380,1,&gl_sample_counts);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12cb);
    GVar3 = gl_sample_counts;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (long)gl_sample_counts) {
      uVar10 = (long)gl_sample_counts * 4;
    }
    pvVar8 = operator_new__(uVar10);
    (**(code **)(lVar7 + 0x880))(target,0x8058,0x80a9,GVar3,pvVar8);
    iVar5 = 0;
    for (lVar9 = 0; lVar9 < gl_sample_counts; lVar9 = lVar9 + 1) {
      isConformant = 0;
      (**(code **)(lVar7 + 0x870))
                (target,0x8058,*(undefined4 *)((long)pvVar8 + lVar9 * 4),0x9374,1,&isConformant);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glGetInternalformatSampleivNV() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x12d8);
      if (isConformant != 0) {
        iVar1 = *(int *)((long)pvVar8 + lVar9 * 4);
        if (iVar5 < iVar1) {
          iVar5 = iVar1;
        }
      }
    }
    operator_delete__(pvVar8);
    local_34 = iVar5;
  }
  else {
    (**(code **)(lVar7 + 0x868))(0x910e,&local_34);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12e6);
  }
  return local_34;
}

Assistant:

glw::GLint TextureViewTestViewSampling::getMaxConformantSampleCount(glw::GLenum target, glw::GLenum internalFormat)
{
	(void)internalFormat;
	glw::GLint max_conformant_samples = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return the max conformant sample count if extension is supported */
	if (m_context.getContextInfo().isExtensionSupported("GL_NV_internalformat_sample_query"))
	{
		glw::GLint gl_sample_counts = 0;
		gl.getInternalformativ(target, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 1, &gl_sample_counts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname");

		/* Check and return the first conformant sample count */
		glw::GLint* gl_supported_samples = new glw::GLint[gl_sample_counts];
		if (gl_supported_samples)
		{
			gl.getInternalformativ(target, GL_RGBA8, GL_SAMPLES, gl_sample_counts, gl_supported_samples);

			for (glw::GLint i = 0; i < gl_sample_counts; i++)
			{
				glw::GLint isConformant = 0;
				gl.getInternalformatSampleivNV(target, GL_RGBA8, gl_supported_samples[i], GL_CONFORMANT_NV, 1,
											   &isConformant);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformatSampleivNV() call(s) failed");

				if (isConformant && gl_supported_samples[i] > max_conformant_samples)
				{
					max_conformant_samples = gl_supported_samples[i];
				}
			}
			delete[] gl_supported_samples;
		}
	}
	else
	{
		/* Otherwise return GL_MAX_COLOR_TEXTURE_SAMPLES */
		gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &max_conformant_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
	}

	return max_conformant_samples;
}